

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcmp.c
# Opt level: O3

int memcmp(void *__s1,void *__s2,size_t __n)

{
  size_t sVar1;
  uchar *p2;
  uchar *p1;
  
  if (__n != 0) {
    sVar1 = 0;
    do {
      if (*(byte *)((long)__s1 + sVar1) != *(byte *)((long)__s2 + sVar1)) {
        return (uint)*(byte *)((long)__s1 + sVar1) - (uint)*(byte *)((long)__s2 + sVar1);
      }
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return 0;
}

Assistant:

int memcmp( const void * s1, const void * s2, size_t n )
{
    const unsigned char * p1 = ( const unsigned char * ) s1;
    const unsigned char * p2 = ( const unsigned char * ) s2;

    while ( n-- )
    {
        if ( *p1 != *p2 )
        {
            return *p1 - *p2;
        }

        ++p1;
        ++p2;
    }

    return 0;
}